

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall TApp_EvilParseFallthrough_Test::TestBody(TApp_EvilParseFallthrough_Test *this)

{
  App *pAVar1;
  char *pcVar2;
  long lVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  AssertHelper local_178;
  allocator local_16a;
  allocator local_169;
  int val2;
  int val1;
  AssertionResult gtest_ar;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  (this->super_TApp).app.fallthrough_ = true;
  val1 = 0;
  val2 = 0;
  std::__cxx11::string::string((string *)&local_40,"--val1",(allocator *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)&local_180);
  pAVar1 = &(this->super_TApp).app;
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar1,&local_40,&val1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_80,"sub",(allocator *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_a0,"",(allocator *)&local_180);
  pAVar1 = CLI::App::add_subcommand(pAVar1,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_c0,"val2",(allocator *)&gtest_ar);
  pcVar2 = "";
  std::__cxx11::string::string((string *)&local_e0,"",(allocator *)&local_180);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar1,&local_c0,&val2,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string((string *)&gtest_ar,"sub",(allocator *)&local_180);
  std::__cxx11::string::string(local_140,"--val1",(allocator *)&local_178);
  std::__cxx11::string::string(local_120,"1",&local_169);
  std::__cxx11::string::string(local_100,"2",&local_16a);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&gtest_ar,&local_e0);
  lVar3 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  TApp::run(&this->super_TApp);
  local_180.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"1","val1",(int *)&local_180,&val1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_180.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"2","val2",(int *)&local_180,&val2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x12f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TApp, EvilParseFallthrough) {
    app.fallthrough();
    int val1 = 0, val2 = 0;
    app.add_option("--val1", val1);

    auto sub = app.add_subcommand("sub");
    sub->add_option("val2", val2);

    args = {"sub", "--val1", "1", "2"};
    // Should not throw
    run();

    EXPECT_EQ(1, val1);
    EXPECT_EQ(2, val2);
}